

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

wchar_t * ON_wString::ParseHorizontalSpace
                    (wchar_t *s,int len,bool bParseTab,bool bParseNoBreakSpace,
                    bool bParseZeroWidthSpace)

{
  bool local_29;
  wchar_t local_28;
  int local_24;
  wchar_t c;
  int i;
  bool bParseZeroWidthSpace_local;
  bool bParseNoBreakSpace_local;
  bool bParseTab_local;
  int len_local;
  wchar_t *s_local;
  
  if ((s == (wchar_t *)0x0) || (len < 1)) {
    s_local = (wchar_t *)0x0;
  }
  else {
    local_24 = 0;
    local_28 = *s;
    while( true ) {
      local_29 = false;
      if (local_24 < len) {
        local_29 = IsHorizontalSpace(local_28,bParseTab,bParseNoBreakSpace,bParseZeroWidthSpace);
      }
      if (local_29 == false) break;
      local_24 = local_24 + 1;
      local_28 = s[local_24];
    }
    s_local = s + local_24;
  }
  return s_local;
}

Assistant:

const wchar_t* ON_wString::ParseHorizontalSpace(const wchar_t* s, int len, bool bParseTab, bool bParseNoBreakSpace, bool bParseZeroWidthSpace)
{
  if (nullptr == s || len <= 0)
    return nullptr;

  int i = 0;
  for (wchar_t c = s[i]; i < len && ON_wString::IsHorizontalSpace(c, bParseTab, bParseNoBreakSpace, bParseZeroWidthSpace); c = s[++i])
  {/*empty body*/
  }

  return s + i;
}